

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Signal_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Intercom_Signal_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Intercom_Signal_PDU *this)

{
  ostream *poVar1;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Intercom_Signal_PDU *local_18;
  Intercom_Signal_PDU *this_local;
  
  local_18 = this;
  this_local = (Intercom_Signal_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Intercom Signal PDU-\n");
  Radio_Communications_Header::GetAsString_abi_cxx11_
            (&local_1f0,(Radio_Communications_Header *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  DATA_TYPE::EncodingScheme::GetAsString_abi_cxx11_
            (&local_210,&(this->super_Signal_PDU).m_EncodingScheme);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"Sample Rate:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Signal_PDU).m_ui32SampleRate);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Data Length:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Signal_PDU).m_ui16DataLength);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Samples:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Signal_PDU).m_ui16Samples);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Intercom_Signal_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Intercom Signal PDU-\n"
       << Radio_Communications_Header::GetAsString()
       << m_EncodingScheme.GetAsString()
       << "Sample Rate:        " << m_ui32SampleRate << "\n"
       << "Data Length:        " << m_ui16DataLength << "\n"
       << "Samples:            " << m_ui16Samples    << "\n";

    // Data is not printed as we don't know what the data is.

    return ss.str();
}